

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlHashLookup(void)

{
  int iVar1;
  int iVar2;
  xmlHashTablePtr val;
  xmlChar *val_00;
  void *val_01;
  int local_34;
  int n_key;
  xmlChar *key;
  int n_hash;
  xmlHashTablePtr hash;
  void *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (key._4_4_ = 0; (int)key._4_4_ < 2; key._4_4_ = key._4_4_ + 1) {
    for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlHashTablePtr(key._4_4_,0);
      val_00 = gen_const_xmlChar_ptr(local_34,1);
      val_01 = (void *)xmlHashLookup(val,val_00);
      desret_void_ptr(val_01);
      call_tests = call_tests + 1;
      des_xmlHashTablePtr(key._4_4_,val,0);
      des_const_xmlChar_ptr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlHashLookup",(ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)key._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlHashLookup(void) {
    int test_ret = 0;

    int mem_base;
    void * ret_val;
    xmlHashTablePtr hash; /* hash table */
    int n_hash;
    const xmlChar * key; /* string key */
    int n_key;

    for (n_hash = 0;n_hash < gen_nb_xmlHashTablePtr;n_hash++) {
    for (n_key = 0;n_key < gen_nb_const_xmlChar_ptr;n_key++) {
        mem_base = xmlMemBlocks();
        hash = gen_xmlHashTablePtr(n_hash, 0);
        key = gen_const_xmlChar_ptr(n_key, 1);

        ret_val = xmlHashLookup(hash, key);
        desret_void_ptr(ret_val);
        call_tests++;
        des_xmlHashTablePtr(n_hash, hash, 0);
        des_const_xmlChar_ptr(n_key, key, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlHashLookup",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_hash);
            printf(" %d", n_key);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}